

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldLiteGenerator::ImmutableMapFieldLiteGenerator
          (ImmutableMapFieldLiteGenerator *this,FieldDescriptor *descriptor,int messageBitIndex,
          Context *context)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  _Rb_tree_header *p_Var1;
  char cVar2;
  Type TVar3;
  JavaType JVar4;
  ClassNameResolver *pCVar5;
  FieldGeneratorInfo *info;
  FieldDescriptor *field;
  Descriptor *pDVar6;
  mapped_type *pmVar7;
  LogMessage *pLVar8;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  bool immutable;
  FieldDescriptor *field_02;
  FieldDescriptor *field_03;
  FieldDescriptor *field_04;
  undefined1 in_R8B;
  undefined7 in_register_00000081;
  undefined1 local_100 [38];
  allocator local_da;
  allocator local_d9;
  LogMessage local_d8;
  key_type local_a0;
  JavaType local_80;
  JavaType local_7c;
  key_type local_78;
  ImmutableMapFieldLiteGenerator *local_58;
  key_type local_50;
  
  (this->super_ImmutableFieldLiteGenerator)._vptr_ImmutableFieldLiteGenerator =
       (_func_int **)&PTR__ImmutableMapFieldLiteGenerator_004da778;
  this->descriptor_ = descriptor;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  variables = &this->variables_;
  p_Var1 = &(this->variables_)._M_t._M_impl.super__Rb_tree_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->context_ = context;
  local_58 = this;
  pCVar5 = Context::GetNameResolver(context);
  local_58->name_resolver_ = pCVar5;
  info = Context::GetFieldGeneratorInfo(context,descriptor);
  SetCommonFieldVariables(descriptor,info,variables);
  field = (FieldDescriptor *)Context::GetNameResolver(context);
  pDVar6 = FieldDescriptor::message_type(descriptor);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&local_d8,(ClassNameResolver *)field,pDVar6);
  std::__cxx11::string::string((string *)local_100,"type",(allocator *)&local_a0);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_100);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_d8);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)&local_d8);
  TVar3 = FieldDescriptor::type(descriptor);
  if (TVar3 != TYPE_MESSAGE) {
    internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_map_field_lite.cc"
               ,0x31);
    pLVar8 = internal::LogMessage::operator<<
                       (&local_d8,
                        "CHECK failed: (FieldDescriptor::TYPE_MESSAGE) == (descriptor->type()): ");
    internal::LogFinisher::operator=((LogFinisher *)local_100,pLVar8);
    internal::LogMessage::~LogMessage(&local_d8);
  }
  pDVar6 = FieldDescriptor::message_type(descriptor);
  if (*(char *)(*(long *)(pDVar6 + 0x20) + 0x4b) == '\0') {
    internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_map_field_lite.cc"
               ,0x33);
    pLVar8 = internal::LogMessage::operator<<
                       (&local_d8,"CHECK failed: message->options().map_entry(): ");
    internal::LogFinisher::operator=((LogFinisher *)local_100,pLVar8);
    internal::LogMessage::~LogMessage(&local_d8);
  }
  std::__cxx11::string::string((string *)&local_d8,"key",(allocator *)local_100);
  field_00 = Descriptor::FindFieldByName(pDVar6,(ConstStringParam)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  field_01 = anon_unknown_1::ValueField(descriptor);
  local_7c = GetJavaType(field_00);
  local_80 = GetJavaType(field_01);
  (anonymous_namespace)::TypeName_abi_cxx11_
            ((string *)&local_d8,(_anonymous_namespace_ *)field_00,field,(ClassNameResolver *)0x0,
             (bool)in_R8B);
  std::__cxx11::string::string((string *)local_100,"key_type",(allocator *)&local_a0);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_100);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_d8);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)&local_d8);
  pCVar5 = (ClassNameResolver *)0x1;
  (anonymous_namespace)::TypeName_abi_cxx11_
            ((string *)&local_d8,(_anonymous_namespace_ *)field_00,field,(ClassNameResolver *)0x1,
             (bool)in_R8B);
  std::__cxx11::string::string((string *)local_100,"boxed_key_type",(allocator *)&local_a0);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_100);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_d8);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)&local_d8);
  (anonymous_namespace)::KotlinTypeName_abi_cxx11_
            ((string *)&local_d8,(_anonymous_namespace_ *)field_00,field,pCVar5);
  std::__cxx11::string::string((string *)local_100,"kt_key_type",(allocator *)&local_a0);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_100);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_d8);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)&local_d8);
  (anonymous_namespace)::KotlinTypeName_abi_cxx11_
            ((string *)&local_d8,(_anonymous_namespace_ *)field_01,field,pCVar5);
  std::__cxx11::string::string((string *)local_100,"kt_value_type",(allocator *)&local_a0);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_100);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_d8);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)&local_d8);
  (anonymous_namespace)::WireType_abi_cxx11_
            ((string *)&local_d8,(_anonymous_namespace_ *)field_00,field_02);
  std::__cxx11::string::string((string *)local_100,"key_wire_type",(allocator *)&local_a0);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_100);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_d8);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)&local_d8);
  immutable = SUB81(field,0);
  DefaultValue_abi_cxx11_
            ((string *)&local_d8,(java *)field_00,(FieldDescriptor *)0x1,immutable,
             (ClassNameResolver *)CONCAT71(in_register_00000081,in_R8B));
  std::__cxx11::string::string((string *)local_100,"key_default_value",(allocator *)&local_a0);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_100);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_d8);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)&local_d8);
  IsReferenceType(local_7c);
  std::__cxx11::string::string((string *)&local_d8,"key_null_check",(allocator *)local_100);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_d8);
  std::__cxx11::string::assign((char *)pmVar7);
  std::__cxx11::string::~string((string *)&local_d8);
  IsReferenceType(local_80);
  std::__cxx11::string::string((string *)&local_d8,"value_null_check",(allocator *)local_100);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_d8);
  std::__cxx11::string::assign((char *)pmVar7);
  std::__cxx11::string::~string((string *)&local_d8);
  JVar4 = GetJavaType(field_01);
  if (JVar4 == JAVATYPE_ENUM) {
    std::__cxx11::string::string((string *)&local_d8,"value_type",(allocator *)local_100);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)&local_d8);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::string((string *)&local_d8,"boxed_value_type",(allocator *)local_100);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)&local_d8);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_d8);
    (anonymous_namespace)::WireType_abi_cxx11_
              ((string *)&local_d8,(_anonymous_namespace_ *)field_01,field_03);
    std::__cxx11::string::string((string *)local_100,"value_wire_type",(allocator *)&local_a0);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_100);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_d8);
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string((string *)&local_d8);
    DefaultValue_abi_cxx11_
              ((string *)local_100,(java *)field_01,(FieldDescriptor *)0x1,immutable,
               (ClassNameResolver *)CONCAT71(in_register_00000081,in_R8B));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   ".getNumber()");
    std::__cxx11::string::string((string *)&local_a0,"value_default_value",(allocator *)&local_78);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)local_100);
    (anonymous_namespace)::TypeName_abi_cxx11_
              ((string *)&local_d8,(_anonymous_namespace_ *)field_01,field,(ClassNameResolver *)0x0,
               (bool)in_R8B);
    std::__cxx11::string::string((string *)local_100,"value_enum_type",(allocator *)&local_a0);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_100);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_d8);
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string((string *)&local_d8);
    if (*(char *)(*(long *)(descriptor + 0x10) + 0x3a) == '\x03') {
      std::__cxx11::string::string((string *)local_100,"value_enum_type",(allocator *)&local_78);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,(key_type *)local_100);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                     pmVar7,".UNRECOGNIZED");
      std::__cxx11::string::string((string *)&local_a0,"unrecognized_value",(allocator *)&local_50);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_a0);
      std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_d8);
      pLVar8 = (LogMessage *)local_100;
      goto LAB_00316338;
    }
    DefaultValue_abi_cxx11_
              ((string *)&local_d8,(java *)field_01,(FieldDescriptor *)0x1,immutable,
               (ClassNameResolver *)CONCAT71(in_register_00000081,in_R8B));
    std::__cxx11::string::string((string *)local_100,"unrecognized_value",(allocator *)&local_a0);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_100);
  }
  else {
    (anonymous_namespace)::TypeName_abi_cxx11_
              ((string *)&local_d8,(_anonymous_namespace_ *)field_01,field,(ClassNameResolver *)0x0,
               (bool)in_R8B);
    std::__cxx11::string::string((string *)local_100,"value_type",(allocator *)&local_a0);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_100);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_d8);
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string((string *)&local_d8);
    (anonymous_namespace)::TypeName_abi_cxx11_
              ((string *)&local_d8,(_anonymous_namespace_ *)field_01,field,(ClassNameResolver *)0x1,
               (bool)in_R8B);
    std::__cxx11::string::string((string *)local_100,"boxed_value_type",(allocator *)&local_a0);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_100);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_d8);
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string((string *)&local_d8);
    (anonymous_namespace)::WireType_abi_cxx11_
              ((string *)&local_d8,(_anonymous_namespace_ *)field_01,field_04);
    std::__cxx11::string::string((string *)local_100,"value_wire_type",(allocator *)&local_a0);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_100);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_d8);
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string((string *)&local_d8);
    DefaultValue_abi_cxx11_
              ((string *)&local_d8,(java *)field_01,(FieldDescriptor *)0x1,immutable,
               (ClassNameResolver *)CONCAT71(in_register_00000081,in_R8B));
    std::__cxx11::string::string((string *)local_100,"value_default_value",(allocator *)&local_a0);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_100);
  }
  pLVar8 = &local_d8;
  std::__cxx11::string::operator=((string *)pmVar7,(string *)pLVar8);
  std::__cxx11::string::~string((string *)local_100);
LAB_00316338:
  std::__cxx11::string::~string((string *)pLVar8);
  std::__cxx11::string::string((string *)&local_a0,"boxed_key_type",&local_d9);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_a0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                 pmVar7,", ");
  std::__cxx11::string::string((string *)&local_78,"boxed_value_type",&local_da);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_78);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                 pmVar7);
  std::__cxx11::string::string
            ((string *)&local_50,"type_parameters",(allocator *)(local_100 + 0x25));
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_50);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_d8,"deprecation",(allocator *)local_100);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_d8);
  std::__cxx11::string::assign((char *)pmVar7);
  std::__cxx11::string::~string((string *)&local_d8);
  cVar2 = *(char *)(*(long *)(descriptor + 0x38) + 0x4e);
  if (cVar2 == '\x01') {
    std::__cxx11::string::string((string *)&local_a0,"name",&local_d9);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_a0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   "@kotlin.Deprecated(message = \"Field ",pmVar7);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   " is deprecated\") ");
  }
  else {
    std::__cxx11::string::string((string *)&local_d8,"",(allocator *)local_100);
  }
  std::__cxx11::string::string((string *)&local_78,"kt_deprecation",(allocator *)&local_50);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_78);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_d8);
  if (cVar2 != '\0') {
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  std::__cxx11::string::string((string *)&local_78,"capitalized_name",&local_da);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_78);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                 pmVar7,"DefaultEntryHolder.defaultEntry");
  std::__cxx11::string::string((string *)&local_50,"default_entry",(allocator *)(local_100 + 0x25));
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_50);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

ImmutableMapFieldLiteGenerator::ImmutableMapFieldLiteGenerator(
    const FieldDescriptor* descriptor, int messageBitIndex, Context* context)
    : descriptor_(descriptor),
      context_(context),
      name_resolver_(context->GetNameResolver()) {
  SetMessageVariables(descriptor, messageBitIndex, 0,
                      context->GetFieldGeneratorInfo(descriptor), context,
                      &variables_);
}